

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

void __thiscall wallet::LegacyScriptPubKeyMan::UpgradeKeyMetadata(LegacyScriptPubKeyMan *this)

{
  uchar *puVar1;
  _Rb_tree_header *p_Var2;
  WalletStorage *pWVar3;
  _Head_base<0UL,_wallet::DatabaseBatch_*,_false> _Var4;
  bool bVar5;
  int iVar6;
  WalletDatabase *pWVar7;
  WalletBatch *this_00;
  uchar *puVar8;
  _Base_ptr p_Var9;
  runtime_error *this_01;
  pointer *__ptr;
  long in_FS_OFFSET;
  Span<const_std::byte> seed;
  CKey key;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  CPubKey pubkey;
  CKeyID master_id;
  CExtKey masterKey;
  undefined1 local_f0 [8];
  array<unsigned_char,_32UL> *local_e8;
  unique_lock<std::recursive_mutex> local_e0;
  CPubKey local_cd;
  CKeyID local_8c;
  undefined1 local_78 [56];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_40;
  long local_38;
  undefined4 extraout_var;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e0._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_e0._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_e0);
  iVar6 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[10])
                    ();
  if ((char)iVar6 == '\0') {
    pWVar3 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
    iVar6 = (*pWVar3->_vptr_WalletStorage[4])(pWVar3,2);
    if ((char)iVar6 == '\0') {
      iVar6 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage
                [3])();
      pWVar7 = (WalletDatabase *)CONCAT44(extraout_var,iVar6);
      this_00 = (WalletBatch *)operator_new(0x10);
      (*pWVar7->_vptr_WalletDatabase[0xe])(this_00,pWVar7,1);
      this_00->m_database = pWVar7;
      p_Var9 = (this->super_LegacyDataSPKM).mapKeyMetadata._M_t._M_impl.super__Rb_tree_header.
               _M_header._M_left;
      p_Var2 = &(this->super_LegacyDataSPKM).mapKeyMetadata._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var9 != p_Var2) {
        do {
          puVar1 = (uchar *)((long)&p_Var9[3]._M_right + 4);
          puVar8 = std::
                   __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<160u>::IsNull()const::_lambda(unsigned_char)_1_>>
                             (&p_Var9[3]._M_parent,puVar1);
          if ((puVar8 != puVar1) && ((char)p_Var9[5]._M_color == _S_red)) {
            iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &p_Var9[2]._M_parent,"s");
            if (iVar6 != 0) {
              local_f0[0] = 0;
              local_e8 = (array<unsigned_char,_32UL> *)0x0;
              (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1e])
                        (this,&p_Var9[3]._M_parent,local_f0);
              local_78[0x1c] = '\0';
              local_78[0x1d] = '\0';
              local_78[0x1e] = '\0';
              local_78[0x1f] = '\0';
              local_78[0x20] = '\0';
              local_78[0x21] = '\0';
              local_78[0x22] = '\0';
              local_78[0x23] = '\0';
              local_78[0x24] = '\0';
              local_78[0x25] = '\0';
              local_78[0x26] = '\0';
              local_78[0x27] = '\0';
              local_78[0x28] = '\0';
              local_78[0x29] = '\0';
              local_78[0x2a] = '\0';
              local_78[0x2b] = '\0';
              local_78[0xc] = '\0';
              local_78[0xd] = '\0';
              local_78[0xe] = '\0';
              local_78[0xf] = '\0';
              local_78[0x10] = '\0';
              local_78[0x11] = '\0';
              local_78[0x12] = '\0';
              local_78[0x13] = '\0';
              local_78[0x14] = '\0';
              local_78[0x15] = '\0';
              local_78[0x16] = '\0';
              local_78[0x17] = '\0';
              local_78[0x18] = '\0';
              local_78[0x19] = '\0';
              local_78[0x1a] = '\0';
              local_78[0x1b] = '\0';
              local_78[0x30] = false;
              local_40._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
              seed.m_size._0_4_ = (uint)(local_e8 != (array<unsigned_char,_32UL> *)0x0) << 5;
              seed.m_data = local_e8->_M_elems;
              seed.m_size._4_4_ = 0;
              CExtKey::SetSeed((CExtKey *)local_78,seed);
              CKey::GetPubKey(&local_cd,(CKey *)(local_78 + 0x30));
              CPubKey::GetID(&local_8c,&local_cd);
              p_Var9[4]._M_color =
                   local_8c.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_;
              bVar5 = ParseHDKeypath((string *)&p_Var9[2]._M_parent,
                                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     &p_Var9[4]._M_parent);
              if (!bVar5) {
                this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_01,"Invalid stored hdKeypath");
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  __cxa_throw(this_01,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_00c0722f;
              }
              *(undefined1 *)&p_Var9[5]._M_color = _S_black;
              if (*(int *)&p_Var9[1]._M_right < 0xc) {
                *(undefined4 *)&p_Var9[1]._M_right = 0xc;
              }
              local_cd.vch[0] = 0xff;
              iVar6 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan
                        [0x1f])(this,p_Var9 + 1,&local_cd);
              if ((char)iVar6 != '\0') {
                WalletBatch::WriteKeyMetadata
                          (this_00,(CKeyMetadata *)&p_Var9[1]._M_right,&local_cd,true);
              }
              if ((_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)local_40._M_head_impl
                  != (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
                SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                          ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_40,
                           local_40._M_head_impl);
              }
              if (local_e8 != (array<unsigned_char,_32UL> *)0x0) {
                SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                          ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_e8,
                           local_e8);
              }
            }
          }
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != p_Var2);
      }
      _Var4._M_head_impl =
           (this_00->m_batch)._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      if (_Var4._M_head_impl != (DatabaseBatch *)0x0) {
        (*(_Var4._M_head_impl)->_vptr_DatabaseBatch[5])();
      }
      (this_00->m_batch)._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl = (DatabaseBatch *)0x0;
      operator_delete(this_00,0x10);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00c0722f:
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::UpgradeKeyMetadata()
{
    LOCK(cs_KeyStore);
    if (m_storage.IsLocked() || m_storage.IsWalletFlagSet(WALLET_FLAG_KEY_ORIGIN_METADATA)) {
        return;
    }

    std::unique_ptr<WalletBatch> batch = std::make_unique<WalletBatch>(m_storage.GetDatabase());
    for (auto& meta_pair : mapKeyMetadata) {
        CKeyMetadata& meta = meta_pair.second;
        if (!meta.hd_seed_id.IsNull() && !meta.has_key_origin && meta.hdKeypath != "s") { // If the hdKeypath is "s", that's the seed and it doesn't have a key origin
            CKey key;
            GetKey(meta.hd_seed_id, key);
            CExtKey masterKey;
            masterKey.SetSeed(key);
            // Add to map
            CKeyID master_id = masterKey.key.GetPubKey().GetID();
            std::copy(master_id.begin(), master_id.begin() + 4, meta.key_origin.fingerprint);
            if (!ParseHDKeypath(meta.hdKeypath, meta.key_origin.path)) {
                throw std::runtime_error("Invalid stored hdKeypath");
            }
            meta.has_key_origin = true;
            if (meta.nVersion < CKeyMetadata::VERSION_WITH_KEY_ORIGIN) {
                meta.nVersion = CKeyMetadata::VERSION_WITH_KEY_ORIGIN;
            }

            // Write meta to wallet
            CPubKey pubkey;
            if (GetPubKey(meta_pair.first, pubkey)) {
                batch->WriteKeyMetadata(meta, pubkey, true);
            }
        }
    }
}